

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupByState.hpp
# Opt level: O0

void __thiscall
linq::
GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>
::Init(GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>
       *this)

{
  bool bVar1;
  mapped_type *this_00;
  iterator iVar2;
  IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_> *this_01;
  key_type_conflict local_10d;
  int local_10c;
  int *local_108;
  int *x;
  undefined1 local_a8 [8];
  iterator __end0;
  iterator __begin0;
  IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_> *__range2
  ;
  GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>
  *this_local;
  
  this_01 = &this->source;
  IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::Init
            (this_01);
  std::
  map<bool,_std::vector<int,_std::allocator<int>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&this->result);
  IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::begin
            ((iterator *)&__end0.valid,this_01);
  IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::end
            ((iterator *)local_a8,this_01);
  while( true ) {
    IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
    iterator::iterator((iterator *)&x,(iterator *)local_a8);
    bVar1 = IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>
            ::iterator::operator!=((iterator *)&__end0.valid,(iterator *)&x);
    IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
    iterator::~iterator((iterator *)&x);
    if (!bVar1) break;
    local_10c = IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>
                ::iterator::operator*((iterator *)&__end0.valid);
    local_108 = &local_10c;
    local_10d = std::function<bool_(const_int_&)>::operator()(&this->transformer,local_108);
    this_00 = std::
              map<bool,_std::vector<int,_std::allocator<int>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](&this->result,&local_10d);
    std::vector<int,_std::allocator<int>_>::push_back(this_00,local_108);
    IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
    iterator::operator++((iterator *)&__end0.valid);
  }
  IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::iterator
  ::~iterator((iterator *)local_a8);
  IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::iterator
  ::~iterator((iterator *)&__end0.valid);
  iVar2 = std::
          map<bool,_std::vector<int,_std::allocator<int>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::begin(&this->result);
  (this->current)._M_node = iVar2._M_node;
  return;
}

Assistant:

void Init() override 
			{
				source.Init();
				result.clear();
				
				for(const auto& x : source)
					result[transformer(x)].push_back(x);
				
				current = result.begin();
			}